

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

hugeint_t __thiscall
duckdb::Interpolator<true>::
Interpolate<unsigned_long,duckdb::hugeint_t,duckdb::QuantileIndirect<duckdb::hugeint_t>>
          (Interpolator<true> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<duckdb::hugeint_t> *accessor)

{
  DataChunk *result_00;
  CURSOR *pCVar1;
  duckdb *this_00;
  uint64_t uVar2;
  bool bVar3;
  reference pvVar4;
  ulong uVar5;
  InvalidInputException *this_01;
  int64_t iVar6;
  uint uVar7;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t result_1;
  hugeint_t local_50;
  string local_40;
  
  pCVar1 = accessor->data;
  uVar5 = (pCVar1->scan).current_row_index;
  if ((pCVar1->scan).next_row_index <= lidx || lidx < uVar5) {
    result_00 = &pCVar1->page;
    ColumnDataCollection::Seek(pCVar1->inputs,lidx,&pCVar1->scan,result_00);
    pvVar4 = vector<duckdb::Vector,_true>::operator[](&result_00->data,0);
    pCVar1->data = (hugeint_t *)pvVar4->data;
    pvVar4 = vector<duckdb::Vector,_true>::operator[](&result_00->data,0);
    FlatVector::VerifyFlatVector(pvVar4);
    pCVar1->validity = &pvVar4->validity;
    uVar5 = (pCVar1->scan).current_row_index;
  }
  uVar7 = (int)lidx - (int)uVar5;
  this_00 = (duckdb *)pCVar1->data[uVar7].lower;
  uVar2 = pCVar1->data[uVar7].upper;
  iVar6 = 0;
  input.upper = uVar2;
  input.lower = (uint64_t)this_00;
  bVar3 = TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(input,&local_50,false);
  if (bVar3) {
    return local_50;
  }
  this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  input_00.upper = iVar6;
  input_00.lower = uVar2;
  CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>(&local_40,this_00,input_00);
  InvalidInputException::InvalidInputException(this_01,&local_40);
  __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
	}